

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O2

void __thiscall Storage::Tape::UEF::queue_defined_data(UEF *this,uint32_t length)

{
  byte bVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint bit;
  uint uVar7;
  bool bVar8;
  
  if (2 < length) {
    bVar1 = gzget8(this->file_);
    uVar2 = gzget8(this->file_);
    bVar3 = gzget8(this->file_);
    iVar6 = length - 3;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      bVar4 = gzget8(this->file_);
      bVar5 = bVar4 >> 4 ^ bVar4;
      bVar5 = bVar5 >> 2 ^ bVar5;
      queue_bit(this,0);
      uVar7 = (uint)bVar1;
      while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
        queue_bit(this,(uint)(bVar4 & 1));
        bVar4 = bVar4 >> 1;
      }
      bVar5 = bVar5 >> 1 ^ bVar5;
      uVar7 = (uint)bVar3;
      if (uVar2 == 'O') {
        bVar5 = ~bVar5;
LAB_003ee232:
        bit = (uint)(bVar5 & 1);
        goto LAB_003ee23f;
      }
      if (uVar2 == 'E') goto LAB_003ee232;
      while (uVar7 != 0) {
        bit = 1;
        uVar7 = uVar7 - 1;
LAB_003ee23f:
        queue_bit(this,bit);
      }
    }
  }
  return;
}

Assistant:

void UEF::queue_defined_data(uint32_t length) {
	if(length < 3) return;

	const int bits_per_packet = gzget8(file_);
	const char parity_type = char(gzget8(file_));
	int number_of_stop_bits = gzget8(file_);

	const bool has_extra_stop_wave = (number_of_stop_bits < 0);
	number_of_stop_bits = abs(number_of_stop_bits);

	length -= 3;
	while(length--) {
		uint8_t byte = gzget8(file_);

		uint8_t parity_value = byte;
		parity_value ^= (parity_value >> 4);
		parity_value ^= (parity_value >> 2);
		parity_value ^= (parity_value >> 1);

		queue_bit(0);
		int c = bits_per_packet;
		while(c--) {
			queue_bit(byte&1);
			byte >>= 1;
		}

		switch(parity_type) {
			default: break;
			case 'E': queue_bit(parity_value&1);		break;
			case 'O': queue_bit((parity_value&1) ^ 1);	break;
		}

		int stop_bits = number_of_stop_bits;
		while(stop_bits--) queue_bit(1);
		if(has_extra_stop_wave) {
			Time duration;
			duration.length = 1;
			duration.clock_rate = time_base_ * 4;
			emplace_back(Pulse::Low, duration);
			emplace_back(Pulse::High, duration);
		}
	}
}